

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O0

bool __thiscall QHttpMultiPartIODevice::isSequential(QHttpMultiPartIODevice *this)

{
  qsizetype qVar1;
  QHttpPartPrivate *pQVar2;
  ulong uVar3;
  QList<QHttpPart> *this_00;
  long in_RDI;
  QIODevice *device;
  int a;
  qsizetype in_stack_ffffffffffffffc8;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    this_00 = (QList<QHttpPart> *)(long)local_14;
    qVar1 = QList<QHttpPart>::size((QList<QHttpPart> *)(*(long *)(in_RDI + 0x10) + 0x78));
    if (qVar1 <= (long)this_00) {
      return false;
    }
    QList<QHttpPart>::at(this_00,in_stack_ffffffffffffffc8);
    pQVar2 = QSharedDataPointer<QHttpPartPrivate>::operator->
                       ((QSharedDataPointer<QHttpPartPrivate> *)0x2e4307);
    if ((pQVar2->bodyDevice != (QIODevice *)0x0) &&
       (uVar3 = (**(code **)(*(long *)pQVar2->bodyDevice + 0x60))(), (uVar3 & 1) != 0)) break;
    local_14 = local_14 + 1;
  }
  return true;
}

Assistant:

bool QHttpMultiPartIODevice::isSequential() const
{
    for (int a = 0; a < multiPart->parts.size(); a++) {
        QIODevice *device = multiPart->parts.at(a).d->bodyDevice;
        // we are sequential if any of the bodyDevices of our parts are sequential;
        // when reading from a byte array, we are not sequential
        if (device && device->isSequential())
            return true;
    }
    return false;
}